

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.cpp
# Opt level: O1

void __thiscall Sexp::DumpAtom(Sexp *this,ostream *stream)

{
  string *psVar1;
  size_t sVar2;
  char *pcVar3;
  size_type sVar4;
  int line;
  
  switch(this->kind) {
  case EMPTY:
    pcVar3 = "()";
    goto LAB_0010f0a3;
  default:
    if (this->padding == 0xabababababababab) {
      pcVar3 = "probable heap corruption detected!";
      line = 0x78;
    }
    else {
      pcVar3 = "unknown s-expression!";
      line = 0x7b;
    }
    PanicImpl("/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/sexp.cpp"
              ,line,"DumpAtom",pcVar3);
  case SYMBOL:
    psVar1 = SymbolInterner::GetSymbol_abi_cxx11_((this->field_1).symbol_value);
    pcVar3 = (psVar1->_M_dataplus)._M_p;
    sVar4 = psVar1->_M_string_length;
    break;
  case STRING:
    std::__ostream_insert<char,std::char_traits<char>>(stream,"\"",1);
    pcVar3 = (this->field_1).string_value;
    if (pcVar3 == (char *)0x0) {
      std::ios::clear((int)stream + (int)*(undefined8 *)(*(long *)stream + -0x18));
    }
    else {
      sVar2 = strlen(pcVar3);
      std::__ostream_insert<char,std::char_traits<char>>(stream,pcVar3,sVar2);
    }
    pcVar3 = "\"";
    sVar4 = 1;
    break;
  case FIXNUM:
    std::ostream::_M_insert<double>((this->field_1).fixnum_value);
    return;
  case BOOL:
    if ((this->field_1).bool_value == true) {
      pcVar3 = "#t";
    }
    else {
      pcVar3 = "#f";
    }
LAB_0010f0a3:
    sVar4 = 2;
    break;
  case END_OF_FILE:
    pcVar3 = "#eof";
    sVar4 = 4;
    break;
  case ACTIVATION:
    pcVar3 = "#<activation>";
    sVar4 = 0xd;
    break;
  case FUNCTION:
    pcVar3 = "#<function>";
    sVar4 = 0xb;
    break;
  case NATIVE_FUNCTION:
    pcVar3 = "#<native function>";
    sVar4 = 0x12;
    break;
  case MEANING:
    (*(code *)(((this->field_1).activation)->parent->field_1).symbol_value)
              ((this->field_1).activation,stream);
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,pcVar3,sVar4);
  return;
}

Assistant:

void Sexp::DumpAtom(std::ostream &stream) const {
  if (IsString()) {
    stream << "\"" << this->string_value << "\"";
    return;
  }

  if (IsSymbol()) {
    stream << SymbolInterner::GetSymbol(this->symbol_value);
    return;
  }

  if (IsFixnum()) {
    stream << this->fixnum_value;
    return;
  }

  if (IsBool()) {
    if (this->bool_value) {
      stream << "#t";
    } else {
      stream << "#f";
    }

    return;
  }

  if (IsEof()) {
    stream << "#eof";
    return;
  }

  if (IsEmpty()) {
    stream << "()";
    return;
  }

  if (IsActivation()) {
    stream << "#<activation>";
    return;
  }

  if (IsFunction()) {
    stream << "#<function>";
    return;
  }

  if (IsNativeFunction()) {
    stream << "#<native function>";
    return;
  }

  if (IsMeaning()) {
    this->meaning->Dump(stream);
    return;
  }

  if (padding == 0xabababababababab) {
    PANIC("probable heap corruption detected!");
  }

  PANIC("unknown s-expression!");
}